

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::CommandLineInterfaceTest_EditionDefaults_Test::TestBody
          (CommandLineInterfaceTest_EditionDefaults_Test *this)

{
  bool bVar1;
  Descriptor *this_00;
  FileDescriptor *this_01;
  char *message;
  _Head_base<0UL,_const_char_*,_false> in_stack_fffffffffffffee0;
  AssertHelper local_100;
  Message local_f8;
  protobuf local_f0 [8];
  char local_e8 [8];
  undefined1 local_e0 [8];
  AssertionResult gtest_ar;
  undefined1 local_c0 [8];
  FeatureSetDefaults defaults;
  string local_80;
  string local_50;
  string_view local_30;
  string_view local_20;
  CommandLineInterfaceTest_EditionDefaults_Test *local_10;
  CommandLineInterfaceTest_EditionDefaults_Test *this_local;
  
  local_10 = this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_20,"google/protobuf/descriptor.proto");
  this_00 = DescriptorProto::descriptor();
  this_01 = Descriptor::file(this_00);
  FileDescriptor::DebugString_abi_cxx11_(&local_50,this_01);
  local_30 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_50);
  CommandLineInterfaceTester::CreateTempFile((CommandLineInterfaceTester *)this,local_20,local_30);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,
             "protocol_compiler --proto_path=$tmpdir --edition_defaults_out=$tmpdir/defaults google/protobuf/descriptor.proto"
             ,(allocator<char> *)((long)&defaults.field_0 + 0x27));
  CommandLineInterfaceTest::Run(&this->super_CommandLineInterfaceTest,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator((allocator<char> *)((long)&defaults.field_0 + 0x27));
  CommandLineInterfaceTester::ExpectNoErrors((CommandLineInterfaceTester *)this);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar.message_,"defaults");
  CommandLineInterfaceTest::ReadEditionDefaults
            ((FeatureSetDefaults *)local_c0,&this->super_CommandLineInterfaceTest,
             stack0xffffffffffffff30);
  EqualsProto<char_const*>
            (local_f0,
             "\n                defaults {\n                  edition: EDITION_LEGACY\n                  overridable_features {}\n                  fixed_features {\n                    field_presence: EXPLICIT\n                    enum_type: CLOSED\n                    repeated_field_encoding: EXPANDED\n                    utf8_validation: NONE\n                    message_encoding: LENGTH_PREFIXED\n                    json_format: LEGACY_BEST_EFFORT\n                    enforce_naming_style: STYLE_LEGACY\n                    default_symbol_visibility: EXPORT_ALL\n                  }\n                }\n                defaults {\n                  edition: EDITION_PROTO3\n                  overridable_features {}\n                  fixed_features {\n                    field_presence: IMPLICIT\n                    enum_type: OPEN\n                    repeated_field_encoding: PACKED\n                    utf8_validation: VERIFY\n                    message_encoding: LENGTH_PREFIXED\n                    json_format: ALLOW\n                    enforce_naming_style: STYLE_LEGACY\n                    default_symbol_visibility: EXPORT_ALL\n                  }\n                }\n                defaults {\n                  edition: EDITION_2023\n                  overridable_features {\n                    field_presence: EXPLICIT\n                    enum_type: OPEN\n                    repeated_field_encoding: PACKED\n                    utf8_validation: VERIFY\n                    message_encoding: LENGTH_PREFIXED\n                    json_format: ALLOW\n                  }\n                  fixed_features {\n                    enforce_naming_style: STYLE_LEGACY\n                    default_symbol_visibility: EXPORT_ALL\n                  }\n                }\n                minimum_edition: EDITION_PROTO2\n                maximum_edition: EDITION_2023\n              "
            );
  testing::internal::
  MakePredicateFormatterFromMatcher<google::protobuf::EqualsProtoMatcherP<char_const*>>
            ((EqualsProtoMatcherP<const_char_*>)in_stack_fffffffffffffee0._M_head_impl);
  testing::internal::
  PredicateFormatterFromMatcher<google::protobuf::EqualsProtoMatcherP<char_const*>>::operator()
            (local_e0,local_e8,(FeatureSetDefaults *)0x1e1c495);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e0);
  if (!bVar1) {
    testing::Message::Message(&local_f8);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_e0);
    testing::internal::AssertHelper::AssertHelper
              (&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface_unittest.cc"
               ,0x80c,message);
    testing::internal::AssertHelper::operator=(&local_100,&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_100);
    testing::Message::~Message(&local_f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e0);
  FeatureSetDefaults::~FeatureSetDefaults((FeatureSetDefaults *)local_c0);
  return;
}

Assistant:

TEST_F(CommandLineInterfaceTest, EditionDefaults) {
  CreateTempFile("google/protobuf/descriptor.proto",
                 google::protobuf::DescriptorProto::descriptor()->file()->DebugString());
  Run("protocol_compiler --proto_path=$tmpdir "
      "--edition_defaults_out=$tmpdir/defaults "
      "google/protobuf/descriptor.proto");
  ExpectNoErrors();

  FeatureSetDefaults defaults = ReadEditionDefaults("defaults");
  EXPECT_THAT(defaults, EqualsProto(R"pb(
                defaults {
                  edition: EDITION_LEGACY
                  overridable_features {}
                  fixed_features {
                    field_presence: EXPLICIT
                    enum_type: CLOSED
                    repeated_field_encoding: EXPANDED
                    utf8_validation: NONE
                    message_encoding: LENGTH_PREFIXED
                    json_format: LEGACY_BEST_EFFORT
                    enforce_naming_style: STYLE_LEGACY
                    default_symbol_visibility: EXPORT_ALL
                  }
                }
                defaults {
                  edition: EDITION_PROTO3
                  overridable_features {}
                  fixed_features {
                    field_presence: IMPLICIT
                    enum_type: OPEN
                    repeated_field_encoding: PACKED
                    utf8_validation: VERIFY
                    message_encoding: LENGTH_PREFIXED
                    json_format: ALLOW
                    enforce_naming_style: STYLE_LEGACY
                    default_symbol_visibility: EXPORT_ALL
                  }
                }
                defaults {
                  edition: EDITION_2023
                  overridable_features {
                    field_presence: EXPLICIT
                    enum_type: OPEN
                    repeated_field_encoding: PACKED
                    utf8_validation: VERIFY
                    message_encoding: LENGTH_PREFIXED
                    json_format: ALLOW
                  }
                  fixed_features {
                    enforce_naming_style: STYLE_LEGACY
                    default_symbol_visibility: EXPORT_ALL
                  }
                }
                minimum_edition: EDITION_PROTO2
                maximum_edition: EDITION_2023
              )pb"));
}